

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_cli.c
# Opt level: O0

int ssl_parse_certificate_request(mbedtls_ssl_context *ssl)

{
  uchar uVar1;
  uchar uVar2;
  mbedtls_ssl_ciphersuite_t *pmVar3;
  uchar *puVar4;
  ulong uVar5;
  long lVar6;
  int ret_00;
  size_t sVar7;
  size_t sVar8;
  char *pcVar9;
  ulong local_60;
  size_t i;
  uchar *sig_alg;
  size_t sig_alg_len;
  mbedtls_ssl_ciphersuite_t *ciphersuite_info;
  size_t dn_len;
  size_t cert_type_len;
  size_t n;
  uchar *buf;
  int ret;
  mbedtls_ssl_context *ssl_local;
  
  pmVar3 = ssl->transform_negotiate->ciphersuite_info;
  mbedtls_debug_print_msg
            (ssl,2,
             "/workspace/llm4binary/github/license_all_cmakelists_25/Dragonchang[P]https_client/mbedtls/library/ssl_cli.c"
             ,0x9fc,"=> parse certificate request");
  if ((((pmVar3->key_exchange == MBEDTLS_KEY_EXCHANGE_PSK) ||
       (pmVar3->key_exchange == MBEDTLS_KEY_EXCHANGE_RSA_PSK)) ||
      (pmVar3->key_exchange == MBEDTLS_KEY_EXCHANGE_DHE_PSK)) ||
     ((pmVar3->key_exchange == MBEDTLS_KEY_EXCHANGE_ECDHE_PSK ||
      (pmVar3->key_exchange == MBEDTLS_KEY_EXCHANGE_ECJPAKE)))) {
    mbedtls_debug_print_msg
              (ssl,2,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Dragonchang[P]https_client/mbedtls/library/ssl_cli.c"
               ,0xa04,"<= skip parse certificate request");
    ssl->state = ssl->state + 1;
    return 0;
  }
  if (ssl->record_read == 0) {
    ret_00 = mbedtls_ssl_read_record(ssl);
    if (ret_00 != 0) {
      mbedtls_debug_print_ret
                (ssl,1,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Dragonchang[P]https_client/mbedtls/library/ssl_cli.c"
                 ,0xa0d,"mbedtls_ssl_read_record",ret_00);
      return ret_00;
    }
    if (ssl->in_msgtype != 0x16) {
      mbedtls_debug_print_msg
                (ssl,1,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Dragonchang[P]https_client/mbedtls/library/ssl_cli.c"
                 ,0xa13,"bad certificate request message");
      return -0x7700;
    }
    ssl->record_read = 1;
  }
  ssl->client_auth = 0;
  ssl->state = ssl->state + 1;
  if (*ssl->in_msg == '\r') {
    ssl->client_auth = ssl->client_auth + 1;
  }
  pcVar9 = "no";
  if (ssl->client_auth != 0) {
    pcVar9 = "a";
  }
  mbedtls_debug_print_msg
            (ssl,3,
             "/workspace/llm4binary/github/license_all_cmakelists_25/Dragonchang[P]https_client/mbedtls/library/ssl_cli.c"
             ,0xa21,"got %s certificate request",pcVar9);
  if (ssl->client_auth != 0) {
    ssl->record_read = 0;
    puVar4 = ssl->in_msg;
    sVar7 = mbedtls_ssl_hs_hdr_len(ssl);
    cert_type_len = (size_t)puVar4[sVar7];
    uVar5 = ssl->in_hslen;
    sVar7 = mbedtls_ssl_hs_hdr_len(ssl);
    if (uVar5 < sVar7 + 2 + cert_type_len) {
      mbedtls_debug_print_msg
                (ssl,1,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Dragonchang[P]https_client/mbedtls/library/ssl_cli.c"
                 ,0xa48,"bad certificate request message");
      return -0x7a80;
    }
    if (ssl->minor_ver == 3) {
      sVar7 = mbedtls_ssl_hs_hdr_len(ssl);
      uVar1 = puVar4[sVar7 + 1 + cert_type_len];
      sVar7 = mbedtls_ssl_hs_hdr_len(ssl);
      uVar2 = puVar4[sVar7 + 2 + cert_type_len];
      sVar7 = mbedtls_ssl_hs_hdr_len(ssl);
      lVar6 = cert_type_len + sVar7 + 3;
      for (local_60 = 0; local_60 < (ulong)(long)(int)(uint)CONCAT11(uVar1,uVar2);
          local_60 = local_60 + 2) {
        mbedtls_debug_print_msg
                  (ssl,3,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/Dragonchang[P]https_client/mbedtls/library/ssl_cli.c"
                   ,0xa58,"Supported Signature Algorithm found: %d,%d",
                   (ulong)puVar4[local_60 + lVar6],(uint)puVar4[local_60 + lVar6 + 1]);
      }
      cert_type_len = (long)(int)(uint)CONCAT11(uVar1,uVar2) + 2U + cert_type_len;
      uVar5 = ssl->in_hslen;
      sVar7 = mbedtls_ssl_hs_hdr_len(ssl);
      if (uVar5 < sVar7 + 2 + cert_type_len) {
        mbedtls_debug_print_msg
                  (ssl,1,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/Dragonchang[P]https_client/mbedtls/library/ssl_cli.c"
                   ,0xa60,"bad certificate request message");
        return -0x7a80;
      }
    }
    sVar7 = mbedtls_ssl_hs_hdr_len(ssl);
    uVar1 = puVar4[sVar7 + 1 + cert_type_len];
    sVar7 = mbedtls_ssl_hs_hdr_len(ssl);
    uVar2 = puVar4[sVar7 + 2 + cert_type_len];
    sVar7 = ssl->in_hslen;
    sVar8 = mbedtls_ssl_hs_hdr_len(ssl);
    if (sVar7 != sVar8 + 3 + (long)(int)(uint)CONCAT11(uVar1,uVar2) + cert_type_len) {
      mbedtls_debug_print_msg
                (ssl,1,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Dragonchang[P]https_client/mbedtls/library/ssl_cli.c"
                 ,0xa6d,"bad certificate request message");
      return -0x7a80;
    }
  }
  mbedtls_debug_print_msg
            (ssl,2,
             "/workspace/llm4binary/github/license_all_cmakelists_25/Dragonchang[P]https_client/mbedtls/library/ssl_cli.c"
             ,0xa72,"<= parse certificate request");
  return 0;
}

Assistant:

static int ssl_parse_certificate_request( mbedtls_ssl_context *ssl )
{
    int ret;
    unsigned char *buf;
    size_t n = 0;
    size_t cert_type_len = 0, dn_len = 0;
    const mbedtls_ssl_ciphersuite_t *ciphersuite_info = ssl->transform_negotiate->ciphersuite_info;

    MBEDTLS_SSL_DEBUG_MSG( 2, ( "=> parse certificate request" ) );

    if( ciphersuite_info->key_exchange == MBEDTLS_KEY_EXCHANGE_PSK ||
        ciphersuite_info->key_exchange == MBEDTLS_KEY_EXCHANGE_RSA_PSK ||
        ciphersuite_info->key_exchange == MBEDTLS_KEY_EXCHANGE_DHE_PSK ||
        ciphersuite_info->key_exchange == MBEDTLS_KEY_EXCHANGE_ECDHE_PSK ||
        ciphersuite_info->key_exchange == MBEDTLS_KEY_EXCHANGE_ECJPAKE )
    {
        MBEDTLS_SSL_DEBUG_MSG( 2, ( "<= skip parse certificate request" ) );
        ssl->state++;
        return( 0 );
    }

    if( ssl->record_read == 0 )
    {
        if( ( ret = mbedtls_ssl_read_record( ssl ) ) != 0 )
        {
            MBEDTLS_SSL_DEBUG_RET( 1, "mbedtls_ssl_read_record", ret );
            return( ret );
        }

        if( ssl->in_msgtype != MBEDTLS_SSL_MSG_HANDSHAKE )
        {
            MBEDTLS_SSL_DEBUG_MSG( 1, ( "bad certificate request message" ) );
            return( MBEDTLS_ERR_SSL_UNEXPECTED_MESSAGE );
        }

        ssl->record_read = 1;
    }

    ssl->client_auth = 0;
    ssl->state++;

    if( ssl->in_msg[0] == MBEDTLS_SSL_HS_CERTIFICATE_REQUEST )
        ssl->client_auth++;

    MBEDTLS_SSL_DEBUG_MSG( 3, ( "got %s certificate request",
                        ssl->client_auth ? "a" : "no" ) );

    if( ssl->client_auth == 0 )
        goto exit;

    ssl->record_read = 0;

    /*
     *  struct {
     *      ClientCertificateType certificate_types<1..2^8-1>;
     *      SignatureAndHashAlgorithm
     *        supported_signature_algorithms<2^16-1>; -- TLS 1.2 only
     *      DistinguishedName certificate_authorities<0..2^16-1>;
     *  } CertificateRequest;
     *
     *  Since we only support a single certificate on clients, let's just
     *  ignore all the information that's supposed to help us pick a
     *  certificate.
     *
     *  We could check that our certificate matches the request, and bail out
     *  if it doesn't, but it's simpler to just send the certificate anyway,
     *  and give the server the opportunity to decide if it should terminate
     *  the connection when it doesn't like our certificate.
     *
     *  Same goes for the hash in TLS 1.2's signature_algorithms: at this
     *  point we only have one hash available (see comments in
     *  write_certificate_verify), so let's just use what we have.
     *
     *  However, we still minimally parse the message to check it is at least
     *  superficially sane.
     */
    buf = ssl->in_msg;

    /* certificate_types */
    cert_type_len = buf[mbedtls_ssl_hs_hdr_len( ssl )];
    n = cert_type_len;

    if( ssl->in_hslen < mbedtls_ssl_hs_hdr_len( ssl ) + 2 + n )
    {
        MBEDTLS_SSL_DEBUG_MSG( 1, ( "bad certificate request message" ) );
        return( MBEDTLS_ERR_SSL_BAD_HS_CERTIFICATE_REQUEST );
    }

    /* supported_signature_algorithms */
#if defined(MBEDTLS_SSL_PROTO_TLS1_2)
    if( ssl->minor_ver == MBEDTLS_SSL_MINOR_VERSION_3 )
    {
        size_t sig_alg_len = ( ( buf[mbedtls_ssl_hs_hdr_len( ssl ) + 1 + n] <<  8 )
                             | ( buf[mbedtls_ssl_hs_hdr_len( ssl ) + 2 + n]       ) );
#if defined(MBEDTLS_DEBUG_C)
        unsigned char* sig_alg = buf + mbedtls_ssl_hs_hdr_len( ssl ) + 3 + n;
        size_t i;

        for( i = 0; i < sig_alg_len; i += 2 )
        {
            MBEDTLS_SSL_DEBUG_MSG( 3, ( "Supported Signature Algorithm found: %d,%d", sig_alg[i], sig_alg[i + 1]  ) );
        }
#endif

        n += 2 + sig_alg_len;

        if( ssl->in_hslen < mbedtls_ssl_hs_hdr_len( ssl ) + 2 + n )
        {
            MBEDTLS_SSL_DEBUG_MSG( 1, ( "bad certificate request message" ) );
            return( MBEDTLS_ERR_SSL_BAD_HS_CERTIFICATE_REQUEST );
        }
    }
#endif /* MBEDTLS_SSL_PROTO_TLS1_2 */

    /* certificate_authorities */
    dn_len = ( ( buf[mbedtls_ssl_hs_hdr_len( ssl ) + 1 + n] <<  8 )
             | ( buf[mbedtls_ssl_hs_hdr_len( ssl ) + 2 + n]       ) );

    n += dn_len;
    if( ssl->in_hslen != mbedtls_ssl_hs_hdr_len( ssl ) + 3 + n )
    {
        MBEDTLS_SSL_DEBUG_MSG( 1, ( "bad certificate request message" ) );
        return( MBEDTLS_ERR_SSL_BAD_HS_CERTIFICATE_REQUEST );
    }

exit:
    MBEDTLS_SSL_DEBUG_MSG( 2, ( "<= parse certificate request" ) );

    return( 0 );
}